

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O2

int __thiscall cmCPackExternalGenerator::PackageFiles(cmCPackExternalGenerator *this)

{
  cmCPackExternalVersionGenerator *pcVar1;
  cmMakefile *this_00;
  cmCPackLog *this_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Value *this_02;
  StreamWriter *pSVar5;
  char *in_name;
  ostream *poVar6;
  uint uVar7;
  char *local_478 [4];
  string filename;
  Value root;
  string local_410;
  StreamWriterBuilder builder;
  Value local_3c0;
  ostringstream cmCPackLog_msg;
  ofstream fout;
  
  Json::StreamWriterBuilder::StreamWriterBuilder(&builder);
  Json::Value::Value(&local_3c0,"  ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"indentation",(allocator<char> *)&fout);
  this_02 = Json::StreamWriterBuilder::operator[](&builder,&local_410);
  Json::Value::operator=(this_02,&local_3c0);
  std::__cxx11::string::~string((string *)&local_410);
  Json::Value::~Value(&local_3c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"package.json",(allocator<char> *)&fout);
  if ((this->super_cmCPackGenerator).packageFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_cmCPackGenerator).packageFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)&filename);
  }
  std::ofstream::ofstream(&fout,filename._M_dataplus._M_p,_S_out);
  pSVar5 = Json::StreamWriterBuilder::newStreamWriter(&builder);
  Json::Value::Value(&root,objectValue);
  pcVar1 = (this->Generator)._M_t.
           super___uniq_ptr_impl<cmCPackExternalGenerator::cmCPackExternalVersionGenerator,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
           .
           super__Head_base<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_false>
           ._M_head_impl;
  iVar4 = (*pcVar1->_vptr_cmCPackExternalVersionGenerator[2])(pcVar1,&root);
  uVar7 = 0;
  if (iVar4 != 0) {
    iVar4 = (*pSVar5->_vptr_StreamWriter[2])(pSVar5,&root,&fout);
    if (iVar4 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_EXTERNAL_PACKAGE_SCRIPT",
                 (allocator<char> *)local_478);
      in_name = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg)
      ;
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      uVar7 = 1;
      if ((in_name != (char *)0x0) && (*in_name != '\0')) {
        bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
        if (bVar2) {
          this_00 = (this->super_cmCPackGenerator).MakefileMap;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCPackLog_msg,in_name,(allocator<char> *)local_478);
          bVar2 = cmMakefile::ReadListFile(this_00,(string *)&cmCPackLog_msg);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          bVar3 = cmSystemTools::GetErrorOccuredFlag();
          uVar7 = (uint)(bVar2 && !bVar3);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,
                                   "CPACK_EXTERNAL_PACKAGE_SCRIPT does not contain a full file path"
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
          this_01 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(this_01,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackExternalGenerator.cxx"
                          ,0x43,local_478[0]);
          std::__cxx11::string::~string((string *)local_478);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          uVar7 = 0;
        }
      }
    }
  }
  Json::Value::~Value(&root);
  if (pSVar5 != (StreamWriter *)0x0) {
    (*pSVar5->_vptr_StreamWriter[1])(pSVar5);
  }
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&filename);
  Json::StreamWriterBuilder::~StreamWriterBuilder(&builder);
  return uVar7;
}

Assistant:

int cmCPackExternalGenerator::PackageFiles()
{
  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";

  std::string filename = "package.json";
  if (!this->packageFileNames.empty()) {
    filename = this->packageFileNames[0];
  }

  cmsys::ofstream fout(filename.c_str());
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());

  Json::Value root(Json::objectValue);

  if (!this->Generator->WriteToJSON(root)) {
    return 0;
  }

  if (jout->write(root, &fout)) {
    return 0;
  }

  const char* packageScript = this->GetOption("CPACK_EXTERNAL_PACKAGE_SCRIPT");
  if (packageScript && *packageScript) {
    if (!cmSystemTools::FileIsFullPath(packageScript)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "CPACK_EXTERNAL_PACKAGE_SCRIPT does not contain a full file path"
          << std::endl);
      return 0;
    }

    bool res = this->MakefileMap->ReadListFile(packageScript);

    if (cmSystemTools::GetErrorOccuredFlag() || !res) {
      return 0;
    }
  }

  return 1;
}